

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

Endpoints * __thiscall
icu_63::number::impl::ParsedPatternInfo::getEndpoints(ParsedPatternInfo *this,int32_t flags)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool padding;
  bool isNegative;
  bool prefix;
  int32_t flags_local;
  ParsedPatternInfo *this_local;
  
  bVar1 = (flags & 0x100U) == 0;
  bVar2 = (flags & 0x200U) == 0;
  bVar3 = (flags & 0x400U) == 0;
  if ((bVar2) || (bVar3)) {
    if (bVar3) {
      if ((bVar1) || (bVar2)) {
        if (bVar1) {
          if (bVar2) {
            this_local = (ParsedPatternInfo *)&(this->positive).suffixEndpoints;
          }
          else {
            this_local = (ParsedPatternInfo *)&(this->negative).suffixEndpoints;
          }
        }
        else {
          this_local = (ParsedPatternInfo *)&(this->positive).prefixEndpoints;
        }
      }
      else {
        this_local = (ParsedPatternInfo *)&(this->negative).prefixEndpoints;
      }
    }
    else {
      this_local = (ParsedPatternInfo *)&(this->positive).paddingEndpoints;
    }
  }
  else {
    this_local = (ParsedPatternInfo *)&(this->negative).paddingEndpoints;
  }
  return (Endpoints *)this_local;
}

Assistant:

const Endpoints& ParsedPatternInfo::getEndpoints(int32_t flags) const {
    bool prefix = (flags & AFFIX_PREFIX) != 0;
    bool isNegative = (flags & AFFIX_NEGATIVE_SUBPATTERN) != 0;
    bool padding = (flags & AFFIX_PADDING) != 0;
    if (isNegative && padding) {
        return negative.paddingEndpoints;
    } else if (padding) {
        return positive.paddingEndpoints;
    } else if (prefix && isNegative) {
        return negative.prefixEndpoints;
    } else if (prefix) {
        return positive.prefixEndpoints;
    } else if (isNegative) {
        return negative.suffixEndpoints;
    } else {
        return positive.suffixEndpoints;
    }
}